

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O3

void Aig_ManUpdateReverseLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  int iVar1;
  Aig_Obj_t *pObj;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int Fill;
  int Fill_00;
  int Fill_01;
  int extraout_EDX_01;
  long lVar7;
  Vec_Int_t *pVVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  
  pVVar8 = p->vLevelR;
  if (pVVar8 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0xfb,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObjNew->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObjNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0xfc,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->vLevels == (Vec_Vec_t *)0x0) {
    uVar2 = Aig_ManLevels(p);
    pVVar5 = (Vec_Vec_t *)malloc(0x10);
    iVar4 = 8;
    if (uVar2 < 0xfffffff9) {
      iVar4 = uVar2 + 8;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = iVar4;
    if (iVar4 == 0) {
      ppvVar6 = (void **)0x0;
      in_EDX = extraout_EDX;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar4 << 3);
      in_EDX = extraout_EDX_00;
    }
    pVVar5->pArray = ppvVar6;
    p->vLevels = pVVar5;
    pVVar8 = p->vLevelR;
    if (pVVar8 == (Vec_Int_t *)0x0) {
LAB_0061b071:
      __assert_fail("p->vLevelR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                    ,0x30,"int Aig_ObjReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
    }
  }
  Vec_IntFillExtra(pVVar8,pObjNew->Id + 1,in_EDX);
  iVar4 = pObjNew->Id;
  if (((long)iVar4 < 0) || (p->vLevelR->nSize <= iVar4)) {
LAB_0061b033:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = p->vLevelR->pArray[iVar4];
  uVar11 = (ulong)uVar2;
  uVar3 = Aig_ObjReverseLevelNew(p,pObjNew);
  if (uVar2 != uVar3) {
    pVVar5 = p->vLevels;
    iVar4 = pVVar5->nSize;
    if (0 < (long)iVar4) {
      ppvVar6 = pVVar5->pArray;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)ppvVar6[lVar7] + 4) = 0;
        lVar7 = lVar7 + 1;
      } while (iVar4 != lVar7);
    }
    Vec_VecPush(pVVar5,uVar2,pObjNew);
    pObjNew->field_0x18 = pObjNew->field_0x18 | 0x10;
    if ((int)uVar2 < p->vLevels->nSize) {
      do {
        if ((int)uVar2 < 0) {
LAB_0061b090:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        pVVar5 = p->vLevels;
        iVar4 = pVVar5->nSize;
        iVar10 = (int)uVar11;
        if (iVar4 <= iVar10) goto LAB_0061b090;
        lVar7 = 0;
        while( true ) {
          iVar1 = *(int *)((long)pVVar5->pArray[uVar11] + 4);
          if (iVar1 <= lVar7) break;
          pObj = *(Aig_Obj_t **)(*(long *)((long)pVVar5->pArray[uVar11] + 8) + lVar7 * 8);
          *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffef;
          if (p->vLevelR == (Vec_Int_t *)0x0) goto LAB_0061b071;
          Vec_IntFillExtra(p->vLevelR,pObj->Id + 1,iVar1);
          iVar4 = pObj->Id;
          if (((long)iVar4 < 0) || (p->vLevelR->nSize <= iVar4)) goto LAB_0061b033;
          if (uVar11 != (uint)p->vLevelR->pArray[iVar4]) {
            __assert_fail("LevelOld == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                          ,0x10f,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          iVar4 = Aig_ObjReverseLevelNew(p,pObj);
          if (p->vLevelR == (Vec_Int_t *)0x0) {
            __assert_fail("p->vLevelR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                          ,0x43,"void Aig_ObjSetReverseLevel(Aig_Man_t *, Aig_Obj_t *, int)");
          }
          Vec_IntFillExtra(p->vLevelR,pObj->Id + 1,Fill);
          iVar1 = pObj->Id;
          if (((long)iVar1 < 0) || (pVVar8 = p->vLevelR, pVVar8->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar8->pArray[iVar1] = iVar4;
          Vec_IntFillExtra(pVVar8,pObj->Id + 1,Fill_00);
          iVar4 = pObj->Id;
          if (((long)iVar4 < 0) || (pVVar8 = p->vLevelR, pVVar8->nSize <= iVar4)) goto LAB_0061b033;
          if (uVar11 != (uint)pVVar8->pArray[iVar4]) {
            pvVar9 = (void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
            iVar4 = Fill_01;
            if (((*(ulong *)((long)pvVar9 + 0x18) & 0x10) == 0) &&
               (((uint)*(ulong *)((long)pvVar9 + 0x18) & 7) - 5 < 2)) {
              Vec_IntFillExtra(pVVar8,*(int *)((long)pvVar9 + 0x24) + 1,Fill_01);
              iVar4 = *(int *)((long)pvVar9 + 0x24);
              if (((long)iVar4 < 0) || (p->vLevelR->nSize <= iVar4)) goto LAB_0061b033;
              iVar4 = p->vLevelR->pArray[iVar4];
              if (iVar4 < iVar10) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x119,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar4,pvVar9);
              *(byte *)((long)pvVar9 + 0x18) = *(byte *)((long)pvVar9 + 0x18) | 0x10;
              iVar4 = extraout_EDX_01;
            }
            pvVar9 = (void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            if (((*(ulong *)((long)pvVar9 + 0x18) & 0x10) == 0) &&
               (((uint)*(ulong *)((long)pvVar9 + 0x18) & 7) - 5 < 2)) {
              if (p->vLevelR == (Vec_Int_t *)0x0) goto LAB_0061b071;
              Vec_IntFillExtra(p->vLevelR,*(int *)((long)pvVar9 + 0x24) + 1,iVar4);
              iVar4 = *(int *)((long)pvVar9 + 0x24);
              if (((long)iVar4 < 0) || (p->vLevelR->nSize <= iVar4)) goto LAB_0061b033;
              iVar4 = p->vLevelR->pArray[iVar4];
              if (iVar4 < iVar10) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x121,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar4,pvVar9);
              *(byte *)((long)pvVar9 + 0x18) = *(byte *)((long)pvVar9 + 0x18) | 0x10;
            }
          }
          lVar7 = lVar7 + 1;
          pVVar5 = p->vLevels;
          iVar4 = pVVar5->nSize;
          if (iVar4 <= iVar10) goto LAB_0061b090;
        }
        uVar11 = uVar11 + 1;
      } while ((int)uVar11 < iVar4);
    }
  }
  return;
}

Assistant:

void Aig_ManUpdateReverseLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k;
    assert( p->vLevelR != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjReverseLevel(p, pObjNew);
    if ( LevelOld == Aig_ObjReverseLevelNew(p, pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Aig_ObjReverseLevel(p, pTemp); 
        assert( LevelOld == Lev );
        Aig_ObjSetReverseLevel( p, pTemp, Aig_ObjReverseLevelNew(p, pTemp) );
        // if the level did not change, to need to check the fanout levels
        if ( Aig_ObjReverseLevel(p, pTemp) == Lev )
            continue;
        // schedule fanins for level update
        pFanin = Aig_ObjFanin0(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
    }
}